

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O0

int pt_evt_apply_tma(pt_time *time,pt_time_cal *tcal,pt_packet_tma *packet,pt_config *config)

{
  int errcode;
  pt_config *config_local;
  pt_packet_tma *packet_local;
  pt_time_cal *tcal_local;
  pt_time *time_local;
  
  time_local._4_4_ = pt_tcal_update_tma(tcal,packet,config);
  if (((-1 < time_local._4_4_) || (time_local._4_4_ == -10)) &&
     ((time_local._4_4_ = pt_time_update_tma(time,packet,config), -1 < time_local._4_4_ ||
      (time_local._4_4_ == -10)))) {
    time_local._4_4_ = 0;
  }
  return time_local._4_4_;
}

Assistant:

static int pt_evt_apply_tma(struct pt_time *time, struct pt_time_cal *tcal,
			    const struct pt_packet_tma *packet,
			    const struct pt_config *config)
{
	int errcode;

	/* We ignore configuration errors.  They will result in imprecise
	 * calibration which will result in imprecise cycle-accurate timing.
	 */
	errcode = pt_tcal_update_tma(tcal, packet, config);
	if ((errcode < 0) && (errcode != -pte_bad_config))
		return errcode;

	/* We ignore configuration errors.  They will result in imprecise
	 * timing and are tracked as packet losses in struct pt_time.
	 */
	errcode = pt_time_update_tma(time, packet, config);
	if ((errcode < 0) && (errcode != -pte_bad_config))
		return errcode;

	return 0;
}